

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O1

TranslationBlock_conflict *
tb_gen_code_tricore(CPUState *cpu,target_ulong_conflict pc,target_ulong_conflict cs_base,
                   uint32_t flags,int cflags)

{
  byte *pbVar1;
  int iVar2;
  undefined4 uVar3;
  TCGContext_conflict6 *s;
  CPUArchState_conflict30 *pCVar4;
  TCGContext_conflict6 *pTVar5;
  byte *pbVar6;
  uc_struct_conflict7 *uc;
  uintptr_t uVar7;
  long *plVar8;
  PageDesc *pPVar9;
  tb_page_addr_t tVar10;
  TranslationBlock *pTVar11;
  ulong extraout_RAX;
  void *pvVar12;
  TranslationBlock *tb;
  void *extraout_RAX_00;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  undefined4 in_register_00000034;
  ulong uVar18;
  ulong in_R10;
  byte *pbVar19;
  byte *pbVar20;
  tb_page_addr_t phys2;
  byte bVar21;
  bool bVar22;
  bool bVar23;
  PageDesc *p2;
  PageDesc *p;
  PageDesc *local_80;
  uint local_78;
  undefined4 uStack_74;
  void *local_70;
  uint32_t local_68;
  uint local_64;
  target_ulong_conflict local_60;
  uint32_t local_5c;
  tb_page_addr_t local_58;
  undefined8 local_50;
  CPUArchState_conflict30 *local_48;
  CPUState *local_40;
  TranslationBlock *local_38;
  
  local_50 = CONCAT44(in_register_00000034,pc);
  s = cpu->uc->tcg_ctx;
  pCVar4 = (CPUArchState_conflict30 *)cpu->env_ptr;
  local_60 = cs_base;
  local_5c = flags;
  local_58 = get_page_addr_code_tricore(pCVar4,pc);
  uVar16 = cflags | 0x10000;
  if (local_58 != 0xffffffffffffffff) {
    uVar16 = cflags;
  }
  uVar14 = cpu->cluster_index;
  tb = (TranslationBlock *)(ulong)uVar14;
  iVar2 = cpu->singlestep_enabled;
  pTVar11 = tcg_tb_alloc_tricore((TCGContext_conflict9 *)s);
  if (pTVar11 == (TranslationBlock *)0x0) {
LAB_00d235a1:
    tb_gen_code_tricore_cold_2();
    pvVar12 = extraout_RAX_00;
LAB_00d235ab:
    (tb->tc).ptr = pvVar12;
    s->code_gen_ptr =
         (void *)((long)local_70 + (long)pvVar12 + (in_R10 & 0xffffffff) + 0xf & 0xfffffffffffffff0)
    ;
    tb->jmp_list_next[0] = 0;
    tb->jmp_list_next[1] = 0;
    *(undefined1 (*) [16])(tb->jmp_target_arg + 1) = (undefined1  [16])0x0;
    tb->jmp_dest[0] = 0;
    uVar15 = (ulong)(ushort)tb->page_addr[1];
    if (uVar15 != 0xffff) {
      tb_set_jmp_target_tricore(tb,0,uVar15 + *(long *)&tb->cflags);
    }
    pCVar4 = local_48;
    if (*(short *)((long)tb->page_addr + 10) != -1) {
      tb_set_jmp_target_tricore
                (tb,1,(ulong)*(ushort *)((long)tb->page_addr + 10) + *(long *)&tb->cflags);
    }
    uVar16 = ((uint)local_50 + (uint)*(ushort *)((long)&tb->cs_base + 4)) - 1 & 0xffffc000;
    phys2 = 0xffffffffffffffff;
    if (((uint)local_50 & 0xffffc000) != uVar16) {
      phys2 = get_page_addr_code_tricore(pCVar4,uVar16);
    }
    tVar10 = local_58;
    uc = cpu->uc;
    local_80 = (PageDesc *)0x0;
    pTVar11 = tb;
    if (local_58 == 0xffffffffffffffff) {
      if ((tb->flags & 0x10000) == 0) {
        __assert_fail("tb->cflags & CF_NOCACHE",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                      ,0x66c,
                      "TranslationBlock *tb_link_page(struct uc_struct *, TranslationBlock *, tb_page_addr_t, tb_page_addr_t)"
                     );
      }
      *(undefined4 *)(tb->page_next + 1) = 0xffffffff;
      *(undefined4 *)((long)tb->page_next + 0xc) = 0xffffffff;
      *(undefined4 *)tb->page_addr = 0xffffffff;
      *(undefined4 *)((long)tb->page_addr + 4) = 0xffffffff;
    }
    else {
      page_lock_pair((uc_struct_conflict15 *)uc,(PageDesc **)&local_78,local_58,&local_80,phys2,1);
      plVar8 = (long *)CONCAT44(uStack_74,local_78);
      uVar15 = (ulong)((uint)tVar10 & 0xffffc000);
      tb->page_next[1] = uVar15;
      tb->orig_tb = (TranslationBlock *)*plVar8;
      lVar13 = *plVar8;
      *plVar8 = (long)tb;
      g_free((gpointer)plVar8[1]);
      plVar8[1] = 0;
      *(undefined4 *)(plVar8 + 2) = 0;
      if (lVar13 == 0) {
        tlb_protect_code_tricore((uc_struct_conflict15 *)uc,uVar15);
      }
      pPVar9 = local_80;
      if (local_80 == (PageDesc *)0x0) {
        tb->page_addr[0] = 0xffffffffffffffff;
      }
      else {
        tb->page_addr[0] = phys2;
        tb->page_next[0] = local_80->first_tb;
        uVar7 = local_80->first_tb;
        local_80->first_tb = (ulong)tb | 1;
        g_free(local_80->code_bitmap);
        pPVar9->code_bitmap = (unsigned_long *)0x0;
        pPVar9->code_write_count = 0;
        if (uVar7 == 0) {
          tlb_protect_code_tricore((uc_struct_conflict15 *)uc,phys2);
        }
      }
      if ((tb->flags >> 0x10 & 1) == 0) {
        local_38 = (TranslationBlock *)0x0;
        uVar16 = (int)local_58 * -0x7a143589 + 0x24234429;
        uVar14 = uVar16 * 0x2000 | uVar16 >> 0x13;
        uVar16 = (int)(local_58 >> 0x20) * -0x7a143589 + 0x85ebca78;
        uVar16 = uVar16 * 0x2000 | uVar16 >> 0x13;
        uVar17 = (int)tb->pc * -0x7a143589 + 1;
        uVar17 = uVar17 * 0x2000 | uVar17 >> 0x13;
        uVar16 = (uVar17 * 0x779b1000 | uVar17 * -0x61c8864f >> 0x14) +
                 (int)tb->cs_base * -0x3d4d51c3 +
                 (uVar14 * 0x3c6ef362 | (uint)((int)(uVar14 * -0x61c8864f) < 0)) +
                 (uVar16 * 0x1bbcd880 | uVar16 * -0x61c8864f >> 0x19) + 0x91a7a6fd;
        uVar16 = (tb->flags & 0xff0affff) * -0x3d4d51c3 +
                 (uVar16 * 0x20000 | uVar16 >> 0xf) * 0x27d4eb2f;
        uVar16 = *(int *)&tb->size * -0x3d4d51c3 + (uVar16 * 0x20000 | uVar16 >> 0xf) * 0x27d4eb2f;
        uVar16 = (uVar16 * 0x20000 | uVar16 >> 0xf) * 0x27d4eb2f;
        uVar16 = (uVar16 >> 0xf ^ uVar16) * -0x7a143589;
        uVar16 = (uVar16 >> 0xd ^ uVar16) * -0x3d4d51c3;
        uVar16 = uVar16 >> 0x10 ^ uVar16;
        *(uint *)(tb->jmp_dest + 1) = uVar16;
        qht_insert((uc_struct_conflict5 *)uc,(qht *)(uc->tcg_ctx->gen_insn_data[0x55] + 1),tb,uVar16
                   ,&local_38);
        if (local_38 != (TranslationBlock *)0x0) {
          tb_page_remove((PageDesc *)CONCAT44(uStack_74,local_78),(TranslationBlock_conflict *)tb);
          lVar13 = CONCAT44(uStack_74,local_78);
          g_free(*(gpointer *)(lVar13 + 8));
          *(undefined8 *)(lVar13 + 8) = 0;
          *(undefined4 *)(lVar13 + 0x10) = 0;
          pTVar11 = local_38;
          if (local_80 != (PageDesc *)0x0) {
            tb_page_remove(local_80,(TranslationBlock_conflict *)tb);
            pPVar9 = local_80;
            g_free(local_80->code_bitmap);
            pPVar9->code_bitmap = (unsigned_long *)0x0;
            pPVar9->code_write_count = 0;
            pTVar11 = local_38;
          }
        }
      }
    }
    if (pTVar11 == tb) {
      tcg_tb_insert_tricore((TCGContext_conflict9 *)s,tb);
      pTVar11 = tb;
    }
    else {
      lVar13 = (long)((uc_struct_conflict10 *)s->gen_insn_data[0x5d][0])->qemu_icache_linesize;
      s->code_gen_ptr = (void *)((long)local_70 - (-lVar13 & lVar13 + 0x97U));
    }
    return (TranslationBlock_conflict *)pTVar11;
  }
  local_68 = uVar14 << 0x18 | uVar16 & 0xffffff;
  uVar16 = uVar16 & 0x7fff;
  uVar14 = 0x200;
  if (uVar16 < 0x200) {
    uVar14 = uVar16;
  }
  if (uVar16 == 0) {
    uVar14 = 0x200;
  }
  uVar16 = 1;
  if (iVar2 == 0) {
    uVar16 = uVar14;
  }
  local_40 = (CPUState *)&pCVar4[-0x32].cpu_model;
  tb = pTVar11;
  local_48 = pCVar4;
LAB_00d23396:
  local_70 = s->code_gen_ptr;
  *(void **)&tb->cflags = local_70;
  *(int *)&tb->pc = (int)local_50;
  *(target_ulong_conflict *)((long)&tb->pc + 4) = local_60;
  *(uint32_t *)&tb->cs_base = local_5c;
  tb->flags = local_68;
  (tb->tc).size = 0;
  uVar3 = (undefined4)cpu->trace_dstate[0];
  tb->size = (short)uVar3;
  tb->icount = (short)((uint)uVar3 >> 0x10);
  s->tb_cflags = local_68;
  do {
    tcg_func_start_tricore((TCGContext_conflict9 *)s);
    s->cpu = local_40;
    local_64 = uVar16;
    gen_intermediate_code_tricore((CPUState_conflict *)cpu,(TranslationBlock_conflict *)tb,uVar16);
    s->cpu = (CPUState *)0x0;
    *(undefined4 *)(tb->page_addr + 1) = 0xffffffff;
    s->tb_jmp_reset_offset = (uint16_t *)(tb->page_addr + 1);
    s->tb_jmp_insn_offset = (uintptr_t *)tb->jmp_reset_offset;
    s->tb_jmp_target_addr = (uintptr_t *)0x0;
    uVar16 = tcg_gen_code_tricore((TCGContext_conflict9 *)s,tb);
    if (-1 < (int)uVar16) {
      pvVar12 = (void *)(ulong)uVar16;
      pbVar1 = (byte *)((long)local_70 + (long)pvVar12);
      uVar15 = (ulong)*(ushort *)((long)&tb->cs_base + 6);
      pbVar19 = pbVar1;
      if (uVar15 == 0) goto LAB_00d2356f;
      pTVar5 = cpu->uc->tcg_ctx;
      pbVar6 = (byte *)pTVar5->code_gen_highwater;
      uVar18 = 0;
      goto LAB_00d234a8;
    }
    tb_gen_code_tricore_cold_1();
    uVar16 = local_78;
  } while ((extraout_RAX & 1) == 0);
  goto LAB_00d23584;
  while (uVar18 = uVar18 + 1, uVar18 != uVar15) {
LAB_00d234a8:
    pTVar11 = (TranslationBlock *)((long)(pTVar5->gen_insn_data + -1) + (uVar18 * 2 + 10) * 2);
    if (uVar18 == 0) {
      pTVar11 = tb;
    }
    uVar16 = *(int *)((long)pTVar5->gen_insn_data[0] + uVar18 * 4) - (int)pTVar11->pc;
    do {
      uVar14 = (int)uVar16 >> 7;
      bVar22 = 0x3f < uVar16;
      bVar23 = (uVar16 & 0x40) == 0;
      pbVar20 = pbVar19 + 1;
      bVar21 = (byte)uVar16 | 0x80;
      if (!bVar22 || !bVar23 && uVar14 == 0xffffffff) {
        bVar21 = (byte)uVar16 & 0x7f;
      }
      *pbVar19 = bVar21;
      pbVar19 = pbVar20;
      uVar16 = uVar14;
    } while (bVar22 && (bVar23 || uVar14 != 0xffffffff));
    if (uVar18 == 0) {
      uVar16 = 0;
    }
    else {
      uVar16 = (uint)pTVar5->gen_insn_end_off[uVar18 - 1];
    }
    uVar16 = pTVar5->gen_insn_end_off[uVar18] - uVar16;
    do {
      uVar14 = (int)uVar16 >> 7;
      bVar22 = 0x3f < uVar16;
      bVar23 = (uVar16 & 0x40) == 0;
      pbVar19 = pbVar20 + 1;
      bVar21 = (byte)uVar16 | 0x80;
      if (!bVar22 || !bVar23 && uVar14 == 0xffffffff) {
        bVar21 = (byte)uVar16 & 0x7f;
      }
      *pbVar20 = bVar21;
      pbVar20 = pbVar19;
      uVar16 = uVar14;
    } while (bVar22 && (bVar23 || uVar14 != 0xffffffff));
    if (pbVar6 < pbVar19) {
      in_R10 = 0xffffffff;
      goto LAB_00d2357a;
    }
  }
LAB_00d2356f:
  in_R10 = (ulong)(uint)((int)pbVar19 - (int)pbVar1);
LAB_00d2357a:
  if (-1 < (int)in_R10) goto LAB_00d235ab;
LAB_00d23584:
  tb = tcg_tb_alloc_tricore((TCGContext_conflict9 *)s);
  uVar16 = local_64;
  if (tb == (TranslationBlock *)0x0) goto LAB_00d235a1;
  goto LAB_00d23396;
}

Assistant:

TranslationBlock *tb_gen_code(CPUState *cpu,
                              target_ulong pc, target_ulong cs_base,
                              uint32_t flags, int cflags)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    TCGContext *tcg_ctx = cpu->uc->tcg_ctx;
    CPUArchState *env = cpu->env_ptr;
    TranslationBlock *tb, *existing_tb;
    tb_page_addr_t phys_pc, phys_page2;
    target_ulong virt_page2;
    tcg_insn_unit *gen_code_buf;
    int gen_code_size, search_size, max_insns;

    assert_memory_lock();
#ifdef HAVE_PTHREAD_JIT_PROTECT
    tb_exec_unlock(tcg_ctx);
#endif
    phys_pc = get_page_addr_code(env, pc);

    if (phys_pc == -1) {
        /* Generate a temporary TB; do not cache */
        cflags |= CF_NOCACHE;
    }

    cflags &= ~CF_CLUSTER_MASK;
    cflags |= ((uint32_t)cpu->cluster_index) << CF_CLUSTER_SHIFT;

    max_insns = cflags & CF_COUNT_MASK;
    if (max_insns == 0) {
        max_insns = CF_COUNT_MASK;
    }
    if (max_insns > TCG_MAX_INSNS) {
        max_insns = TCG_MAX_INSNS;
    }
    if (cpu->singlestep_enabled) {
        max_insns = 1;
    }

 buffer_overflow:
    tb = tcg_tb_alloc(tcg_ctx);
    if (unlikely(!tb)) {
        /* flush must be done */
        tb_flush(cpu);
        mmap_unlock();
        /* Make the execution loop process the flush as soon as possible.  */
        cpu->exception_index = EXCP_INTERRUPT;
        cpu_loop_exit(cpu);
    }

    gen_code_buf = tcg_ctx->code_gen_ptr;
    tb->tc.ptr = gen_code_buf;
    tb->pc = pc;
    tb->cs_base = cs_base;
    tb->flags = flags;
    tb->cflags = cflags;
    tb->orig_tb = NULL;
    tb->trace_vcpu_dstate = *cpu->trace_dstate;
    tcg_ctx->tb_cflags = cflags;
 tb_overflow:

    tcg_func_start(tcg_ctx);

    tcg_ctx->cpu = env_cpu(env);
    UC_TRACE_START(UC_TRACE_TB_TRANS);
    gen_intermediate_code(cpu, tb, max_insns);
    UC_TRACE_END(UC_TRACE_TB_TRANS, "[uc] translate tb 0x%" PRIx64 ": ", tb->pc);
    tcg_ctx->cpu = NULL;

    /* generate machine code */
    tb->jmp_reset_offset[0] = TB_JMP_RESET_OFFSET_INVALID;
    tb->jmp_reset_offset[1] = TB_JMP_RESET_OFFSET_INVALID;
    tcg_ctx->tb_jmp_reset_offset = tb->jmp_reset_offset;
    if (TCG_TARGET_HAS_direct_jump) {
        tcg_ctx->tb_jmp_insn_offset = tb->jmp_target_arg;
        tcg_ctx->tb_jmp_target_addr = NULL;
    } else {
        tcg_ctx->tb_jmp_insn_offset = NULL;
        tcg_ctx->tb_jmp_target_addr = tb->jmp_target_arg;
    }

    gen_code_size = tcg_gen_code(tcg_ctx, tb);
    if (unlikely(gen_code_size < 0)) {
        switch (gen_code_size) {
        case -1:
            /*
             * Overflow of code_gen_buffer, or the current slice of it.
             *
             * TODO: We don't need to re-do gen_intermediate_code, nor
             * should we re-do the tcg optimization currently hidden
             * inside tcg_gen_code.  All that should be required is to
             * flush the TBs, allocate a new TB, re-initialize it per
             * above, and re-do the actual code generation.
             */
            goto buffer_overflow;

        case -2:
            /*
             * The code generated for the TranslationBlock is too large.
             * The maximum size allowed by the unwind info is 64k.
             * There may be stricter constraints from relocations
             * in the tcg backend.
             *
             * Try again with half as many insns as we attempted this time.
             * If a single insn overflows, there's a bug somewhere...
             */
            max_insns = tb->icount;
            assert(max_insns > 1);
            max_insns /= 2;
            goto tb_overflow;

        default:
            g_assert_not_reached();
        }
    }
    search_size = encode_search(cpu->uc, tb, (uint8_t *)gen_code_buf + gen_code_size);
    if (unlikely(search_size < 0)) {
        goto buffer_overflow;
    }
    tb->tc.size = gen_code_size;

    tcg_ctx->code_gen_ptr = (void *)
        ROUND_UP((uintptr_t)gen_code_buf + gen_code_size + search_size,
                 CODE_GEN_ALIGN);

    /* init jump list */
    tb->jmp_list_head = (uintptr_t)NULL;
    tb->jmp_list_next[0] = (uintptr_t)NULL;
    tb->jmp_list_next[1] = (uintptr_t)NULL;
    tb->jmp_dest[0] = (uintptr_t)NULL;
    tb->jmp_dest[1] = (uintptr_t)NULL;

    /* init original jump addresses which have been set during tcg_gen_code() */
    if (tb->jmp_reset_offset[0] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 0);
    }
    if (tb->jmp_reset_offset[1] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 1);
    }

    /* check next page if needed */
    virt_page2 = (pc + tb->size - 1) & TARGET_PAGE_MASK;
    phys_page2 = -1;
    if ((pc & TARGET_PAGE_MASK) != virt_page2) {
        phys_page2 = get_page_addr_code(env, virt_page2);
    }
    /*
     * No explicit memory barrier is required -- tb_link_page() makes the
     * TB visible in a consistent state.
     */
    existing_tb = tb_link_page(cpu->uc, tb, phys_pc, phys_page2);
    /* if the TB already exists, discard what we just translated */
    if (unlikely(existing_tb != tb)) {
        uintptr_t orig_aligned = (uintptr_t)gen_code_buf;

        orig_aligned -= ROUND_UP(sizeof(*tb), tcg_ctx->uc->qemu_icache_linesize);
        tcg_ctx->code_gen_ptr = (void *)orig_aligned;
        return existing_tb;
    }
    tcg_tb_insert(tcg_ctx, tb);
    return tb;
}